

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_DetachItemViaPointer(cJSON *parent,cJSON *item)

{
  cJSON *item_local;
  cJSON *parent_local;
  
  if (((parent == (cJSON *)0x0) || (item == (cJSON *)0x0)) ||
     ((item != parent->child && (item->prev == (cJSON *)0x0)))) {
    parent_local = (cJSON *)0x0;
  }
  else {
    if (item != parent->child) {
      item->prev->next = item->next;
    }
    if (item->next != (cJSON *)0x0) {
      item->next->prev = item->prev;
    }
    if (item == parent->child) {
      parent->child = item->next;
    }
    else if (item->next == (cJSON *)0x0) {
      parent->child->prev = item->prev;
    }
    item->prev = (cJSON *)0x0;
    item->next = (cJSON *)0x0;
    parent_local = item;
  }
  return parent_local;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_DetachItemViaPointer(cJSON *parent, cJSON * const item)
{
    if ((parent == NULL) || (item == NULL) || (item != parent->child && item->prev == NULL))
    {
        return NULL;
    }

    if (item != parent->child)
    {
        /* not the first element */
        item->prev->next = item->next;
    }
    if (item->next != NULL)
    {
        /* not the last element */
        item->next->prev = item->prev;
    }

    if (item == parent->child)
    {
        /* first element */
        parent->child = item->next;
    }
    else if (item->next == NULL)
    {
        /* last element */
        parent->child->prev = item->prev;
    }

    /* make sure the detached item doesn't point anywhere anymore */
    item->prev = NULL;
    item->next = NULL;

    return item;
}